

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reduction.hpp
# Opt level: O2

void __thiscall
mxx::custom_op<long,true>::custom_op<MxxReduce_GlobalReduce_Test::TestBody()::__0>
          (custom_op<long,true> *this)

{
  MPI_Datatype poVar1;
  datatype dt;
  _Any_data __tmp;
  
  *(undefined ***)this = &PTR__custom_op_001ab658;
  *(undefined8 *)(this + 8) = 0;
  *(undefined8 *)(this + 0x10) = 0;
  *(undefined8 *)(this + 0x18) = 0;
  *(undefined8 *)(this + 0x20) = 0;
  this[0x28] = (custom_op<long,true>)0x0;
  dt.builtin = false;
  dt._17_7_ = 0;
  dt._vptr_datatype = (_func_int **)0x0;
  dt.mpitype = (MPI_Datatype)0x0;
  __tmp._M_unused._M_object = operator_new(0x10);
  poVar1 = dt.mpitype;
  *(code **)__tmp._M_unused._0_8_ = custom_function<MxxReduce_GlobalReduce_Test::TestBody()::__0>;
  __tmp._8_8_ = dt.mpitype;
  dt._vptr_datatype = (_func_int **)0x0;
  dt.mpitype = (MPI_Datatype)0x0;
  *(undefined8 *)
   &(((function<void_(void_*,_void_*,_int_*)> *)(this + 8))->super__Function_base)._M_functor =
       __tmp._M_unused._M_object;
  *(MPI_Datatype *)(this + 0x10) = poVar1;
  dt.builtin = false;
  dt._17_7_ = 0;
  *(code **)(this + 0x18) =
       std::
       _Function_handler<void_(void_*,_void_*,_int_*),_std::_Bind<void_(*((lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/ext/mxx/test/test_reductions.cpp:242:47),_std::_Placeholder<1>,_std::_Placeholder<2>,_std::_Placeholder<3>))((lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/ext/mxx/test/test_reductions.cpp:242:47),_void_*,_void_*,_int_*)>_>
       ::_M_manager;
  *(code **)(this + 0x20) =
       std::
       _Function_handler<void_(void_*,_void_*,_int_*),_std::_Bind<void_(*((lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/ext/mxx/test/test_reductions.cpp:242:47),_std::_Placeholder<1>,_std::_Placeholder<2>,_std::_Placeholder<3>))((lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/ext/mxx/test/test_reductions.cpp:242:47),_void_*,_void_*,_int_*)>_>
       ::_M_invoke;
  std::_Function_base::~_Function_base((_Function_base *)&dt);
  dt._vptr_datatype = (_func_int **)&PTR__datatype_001aad50;
  dt.mpitype = (MPI_Datatype)&ompi_mpi_long;
  dt.builtin = true;
  MPI_Type_dup(&ompi_mpi_long,this + 0x30);
  __tmp._0_4_ = 0x543;
  attr_map<int,_std::function<void_(void_*,_void_*,_int_*)>_>::set
            ((MPI_Datatype *)(this + 0x30),(int *)__tmp._M_pod_data,
             (function<void_(void_*,_void_*,_int_*)> *)(this + 8));
  MPI_Op_create(custom_op<long,_true>::mpi_user_function,1,this + 0x38);
  datatype::~datatype(&dt);
  return;
}

Assistant:

custom_op(Func func) : m_builtin(false) {
        if (mxx::is_builtin_type<T>::value) {
            // check if the operator is MPI built-in (in case the type
            // is also a MPI built-in type)
            MPI_Op op = get_builtin_op<T, Func>::op(std::forward<Func>(func));
            if (op != MPI_OP_NULL) {
                // this op is builtin, save it as such and don't copy built-in type
                m_builtin = true;
                m_op = op;
                mxx::datatype dt = mxx::get_datatype<T>();
                m_type_copy = dt.type();
            }
        }
        if (!m_builtin) {
            // create user function
            using namespace std::placeholders;
            m_user_func = std::bind(custom_op::custom_function<Func>,
                                  std::forward<Func>(func), _1, _2, _3);
            // get datatype associated with the type `T`
            mxx::datatype dt = mxx::get_datatype<T>();
            // attach function to a copy of the datatype
            MPI_Type_dup(dt.type(), &m_type_copy);
            attr_map<int, func_t>::set(m_type_copy, 1347, m_user_func);
            // create op
            MPI_Op_create(&custom_op::mpi_user_function, IsCommutative, &m_op);
        }
    }